

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_item_t_conflict MIR_new_expr_data(MIR_context_t ctx,char *name,MIR_item_t_conflict expr_item)

{
  MIR_func_t pMVar1;
  MIR_error_func_t p_Var2;
  char *pcVar3;
  MIR_item_t_conflict pMVar4;
  char *local_48;
  MIR_expr_data_t expr_data;
  MIR_item_t_conflict item;
  MIR_item_t_conflict tab_item;
  MIR_item_t_conflict expr_item_local;
  char *name_local;
  MIR_context_t ctx_local;
  
  expr_data = (MIR_expr_data_t)create_item(ctx,MIR_expr_data_item,"expr data");
  pMVar1 = (MIR_func_t)malloc(0x18);
  (((MIR_item_t_conflict)expr_data)->u).func = pMVar1;
  if (pMVar1 == (MIR_func_t)0x0) {
    free(expr_data);
    p_Var2 = MIR_get_error_func(ctx);
    local_48 = name;
    if (name == (char *)0x0) {
      local_48 = "";
    }
    (*p_Var2)(MIR_alloc_error,"Not enough memory for creation of expr data %s",local_48);
  }
  if (expr_item == (MIR_item_t_conflict)0x0) {
    __assert_fail("expr_item != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x4e2,"MIR_item_t MIR_new_expr_data(MIR_context_t, const char *, MIR_item_t)");
  }
  if ((((expr_item->item_type != MIR_func_item) || (((expr_item->u).func)->vararg_p != '\0')) ||
      (((expr_item->u).func)->nargs != 0)) || (((expr_item->u).func)->nres != 1)) {
    p_Var2 = MIR_get_error_func(ctx);
    pcVar3 = MIR_item_name(ctx,expr_item);
    (*p_Var2)(MIR_binary_io_error,
              "%s can not be an expr which should be non-argument, one result function",pcVar3);
  }
  expr_item_local = (MIR_item_t_conflict)name;
  if (name != (char *)0x0) {
    expr_item_local = (MIR_item_t_conflict)get_ctx_str(ctx,name);
  }
  pMVar1->name = (char *)expr_item_local;
  pMVar1->func_item = expr_item;
  if (expr_item_local == (MIR_item_t_conflict)0x0) {
    DLIST_MIR_item_t_append(&ctx->curr_module->items,(MIR_item_t_conflict)expr_data);
  }
  else {
    pMVar4 = add_item(ctx,(MIR_item_t_conflict)expr_data);
    if (pMVar4 != (MIR_item_t_conflict)expr_data) {
      free(expr_data);
      expr_data = (MIR_expr_data_t)pMVar4;
    }
  }
  return (MIR_item_t_conflict)expr_data;
}

Assistant:

MIR_item_t MIR_new_expr_data (MIR_context_t ctx, const char *name, MIR_item_t expr_item) {
  MIR_item_t tab_item, item = create_item (ctx, MIR_expr_data_item, "expr data");
  MIR_expr_data_t expr_data;

  item->u.expr_data = expr_data = malloc (sizeof (struct MIR_expr_data));
  if (expr_data == NULL) {
    free (item);
    MIR_get_error_func (ctx) (MIR_alloc_error, "Not enough memory for creation of expr data %s",
                              name == NULL ? "" : name);
  }
  mir_assert (expr_item != NULL);
  if (expr_item->item_type != MIR_func_item || expr_item->u.func->vararg_p
      || expr_item->u.func->nargs != 0 || expr_item->u.func->nres != 1)
    MIR_get_error_func (
      ctx) (MIR_binary_io_error,
            "%s can not be an expr which should be non-argument, one result function",
            MIR_item_name (ctx, expr_item));
  if (name != NULL) name = get_ctx_str (ctx, name);
  expr_data->name = name;
  expr_data->expr_item = expr_item;
  if (name == NULL) {
    DLIST_APPEND (MIR_item_t, curr_module->items, item);
  } else if ((tab_item = add_item (ctx, item)) != item) {
    free (item);
    item = tab_item;
  }
  return item;
}